

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

void ZopfliDeflate(ZopfliOptions *options,int btype,int final,uchar *in,size_t insize,uchar *bp,
                  uchar **out,size_t *outsize)

{
  size_t sVar1;
  long lVar2;
  ulong inend;
  size_t instart;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  sVar1 = *outsize;
  instart = 0;
  do {
    lVar2 = insize - instart;
    bVar3 = insize <= instart + 1000000;
    if (!bVar3) {
      lVar2 = 1000000;
    }
    inend = lVar2 + instart;
    ZopfliDeflatePart(options,btype,(uint)(bVar3 && final != 0),in,instart,inend,bp,out,outsize);
    instart = inend;
  } while (inend < insize);
  if (options->verbose == 0) {
    return;
  }
  lVar2 = insize - (*outsize - sVar1);
  auVar4._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar4._0_8_ = lVar2;
  auVar4._12_4_ = 0x45300000;
  auVar5._8_4_ = (int)(insize >> 0x20);
  auVar5._0_8_ = insize;
  auVar5._12_4_ = 0x45300000;
  fprintf(_stderr,"Original Size: %lu, Deflate: %lu, Compression: %f%% Removed\n",
          (((auVar4._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) * 100.0) /
          ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)insize) - 4503599627370496.0)),insize);
  return;
}

Assistant:

void ZopfliDeflate(const ZopfliOptions* options, int btype, int final,
                   const unsigned char* in, size_t insize,
                   unsigned char* bp, unsigned char** out, size_t* outsize) {
 size_t offset = *outsize;
#if ZOPFLI_MASTER_BLOCK_SIZE == 0
  ZopfliDeflatePart(options, btype, final, in, 0, insize, bp, out, outsize);
#else
  size_t i = 0;
  do {
    int masterfinal = (i + ZOPFLI_MASTER_BLOCK_SIZE >= insize);
    int final2 = final && masterfinal;
    size_t size = masterfinal ? insize - i : ZOPFLI_MASTER_BLOCK_SIZE;
    ZopfliDeflatePart(options, btype, final2,
                      in, i, i + size, bp, out, outsize);
    i += size;
  } while (i < insize);
#endif
  if (options->verbose) {
    fprintf(stderr,
            "Original Size: %lu, Deflate: %lu, Compression: %f%% Removed\n",
            (unsigned long)insize, (unsigned long)(*outsize - offset),
            100.0 * (double)(insize - (*outsize - offset)) / (double)insize);
  }
}